

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::initializeTables(QPDFWriter *this,size_t extra)

{
  element_type *peVar1;
  size_t sVar2;
  unsigned_long local_28;
  size_t local_20;
  size_t size;
  size_t extra_local;
  QPDFWriter *this_local;
  
  size = extra;
  extra_local = (size_t)this;
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  sVar2 = QPDF::Writer::tableSize(peVar1->pdf);
  local_28 = sVar2 + 100;
  local_20 = QIntC::to_size<unsigned_long>(&local_28);
  local_20 = local_20 + size;
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  ObjTable<QPDFWriter::Object>::resize(&(peVar1->obj).super_ObjTable<QPDFWriter::Object>,local_20);
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  ObjTable<QPDFWriter::NewObject>::resize
            (&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>,local_20);
  return;
}

Assistant:

void
QPDFWriter::initializeTables(size_t extra)
{
    auto size = QIntC::to_size(QPDF::Writer::tableSize(m->pdf) + 100) + extra;
    m->obj.resize(size);
    m->new_obj.resize(size);
}